

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__horizontal_gather_7_channels_with_1_coeff
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pfVar1 = output_buffer + output_sub_size * 7;
  do {
    fVar3 = *horizontal_coefficients;
    pfVar2 = decode_buffer + (long)horizontal_contributors->n0 * 7;
    fVar4 = *pfVar2;
    fVar5 = pfVar2[1];
    fVar6 = pfVar2[2];
    fVar7 = pfVar2[3];
    pfVar2 = decode_buffer + (long)horizontal_contributors->n0 * 7 + 3;
    fVar8 = pfVar2[1];
    fVar9 = pfVar2[2];
    fVar10 = pfVar2[3];
    output_buffer[3] = *pfVar2 * fVar3;
    output_buffer[4] = fVar8 * fVar3;
    output_buffer[5] = fVar9 * fVar3;
    output_buffer[6] = fVar10 * fVar3;
    *output_buffer = fVar4 * fVar3;
    output_buffer[1] = fVar5 * fVar3;
    output_buffer[2] = fVar6 * fVar3;
    output_buffer[3] = fVar7 * fVar3;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 7;
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_1_coeff)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__1_coeff_only();
    stbir__store_output_tiny();
  } while ( output < output_end );
}